

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Vfs_sys_get_temp_dir(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  void *pvVar1;
  char *pcVar2;
  jx9_vfs *pVfs;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  jx9_result_string(pCtx,"",0);
  pvVar1 = jx9_context_user_data(pCtx);
  if ((pvVar1 == (void *)0x0) || (*(long *)((long)pvVar1 + 0x128) == 0)) {
    pcVar2 = jx9_function_name(pCtx);
    jx9_context_throw_error_format
              (pCtx,2,"IO routine(%s) not implemented in the underlying VFS",pcVar2);
  }
  else {
    (**(code **)((long)pvVar1 + 0x128))(pCtx);
  }
  return 0;
}

Assistant:

static int jx9Vfs_sys_get_temp_dir(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_vfs *pVfs;
	/* Set the empty string as the default return value */
	jx9_result_string(pCtx, "", 0);
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xTempDir == 0 ){
		SXUNUSED(nArg); /* cc warning */
		SXUNUSED(apArg);
		/* IO routine not implemented, return "" */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS", 
			jx9_function_name(pCtx)
			);		
		return JX9_OK;
	}
	/* Perform the requested operation */
	pVfs->xTempDir(pCtx);
	return JX9_OK;
}